

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseExpression(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  bool bVar10;
  bool bVar11;
  State copy;
  
  bVar10 = ParseTemplateParam(state);
  bVar11 = true;
  if ((!bVar10) && (bVar10 = ParseExprPrimary(state), !bVar10)) {
    pcVar1 = state->mangled_cur;
    pcVar2 = state->out_cur;
    pcVar3 = state->out_begin;
    pcVar4 = state->out_end;
    pcVar5 = state->prev_name;
    uVar6 = state->prev_name_length;
    uVar7 = state->nest_level;
    uVar8 = state->append;
    uVar9 = state->overflowed;
    bVar10 = ParseOperatorName(state);
    if ((bVar10) &&
       (((bVar10 = ParseExpression(state), bVar10 && (bVar10 = ParseExpression(state), bVar10)) &&
        (bVar10 = ParseExpression(state), bVar10)))) {
      return true;
    }
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar10 = ParseOperatorName(state);
    if (((bVar10) && (bVar10 = ParseExpression(state), bVar10)) &&
       (bVar10 = ParseExpression(state), bVar10)) {
      return true;
    }
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar10 = ParseOperatorName(state);
    if ((bVar10) && (bVar10 = ParseExpression(state), bVar10)) {
      return true;
    }
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar10 = ParseTwoCharToken(state,"st");
    if ((bVar10) && (bVar10 = ParseType(state), bVar10)) {
      return true;
    }
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar10 = ParseTwoCharToken(state,"sr");
    if ((((bVar10) && (bVar10 = ParseType(state), bVar10)) &&
        (bVar10 = ParseUnqualifiedName(state), bVar10)) &&
       (bVar10 = ParseTemplateArgs(state), bVar10)) {
      return true;
    }
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar10 = ParseTwoCharToken(state,"sr");
    if (((bVar10) && (bVar10 = ParseType(state), bVar10)) &&
       (bVar10 = ParseUnqualifiedName(state), bVar10)) {
      return true;
    }
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

static bool ParseExpression(State *state) {
  if (ParseTemplateParam(state) || ParseExprPrimary(state)) {
    return true;
  }

  State copy = *state;
  if (ParseOperatorName(state) &&
      ParseExpression(state) &&
      ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseOperatorName(state) &&
      ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseOperatorName(state) &&
      ParseExpression(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "st") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseType(state) &&
      ParseUnqualifiedName(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "sr") && ParseType(state) &&
      ParseUnqualifiedName(state)) {
    return true;
  }
  *state = copy;
  return false;
}